

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__dup(int fd)

{
  int iVar1;
  int *piVar2;
  int err;
  int fd_local;
  
  err = dup(fd);
  if (err == -1) {
    piVar2 = __errno_location();
    err = -*piVar2;
  }
  else {
    iVar1 = uv__cloexec_ioctl(err,1);
    if (iVar1 != 0) {
      uv__close(err);
      err = iVar1;
    }
  }
  return err;
}

Assistant:

int uv__dup(int fd) {
  int err;

  fd = dup(fd);

  if (fd == -1)
    return -errno;

  err = uv__cloexec(fd, 1);
  if (err) {
    uv__close(fd);
    return err;
  }

  return fd;
}